

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::
SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ImmutableSamplerDesc_const&)>
          (Serializer<(Diligent::SerializerMode)1> *this,DynamicLinearAllocator *Allocator,
          ImmutableSamplerDesc **SrcArray,uint *Count,
          _func_bool_Serializer<(Diligent::SerializerMode)1>_ptr_ImmutableSamplerDesc_ptr
          *ElemSerializer)

{
  TEnable<unsigned_int> TVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  string msg;
  
  bVar3 = (*Count == 0) != (*SrcArray != (ImmutableSamplerDesc *)0x0);
  if (!bVar3) {
    FormatString<char[26],char[38]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcArray != nullptr) == (Count != 0)",
               (char (*) [38])CONCAT71((int7)((ulong)Count >> 8),bVar3));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1bd);
    std::__cxx11::string::~string((string *)&msg);
  }
  TVar1 = Serialize<unsigned_int>(this,Count);
  if (TVar1) {
    uVar5 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      uVar5 = uVar5 + 1;
      bVar3 = *Count <= uVar5;
      if (bVar3) {
        return bVar3;
      }
      bVar2 = (*ElemSerializer)(this,(ImmutableSamplerDesc *)
                                     ((long)((*SrcArray)->Desc).BorderColor + lVar4 + -0x2c));
      lVar4 = lVar4 + 0x48;
    } while (bVar2);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Serializer<Mode>::SerializeArray(DynamicLinearAllocator* Allocator,
                                      ElemPtrType&            SrcArray,
                                      CountType&              Count,
                                      ArrayElemSerializerType ElemSerializer)
{
    VERIFY_EXPR((SrcArray != nullptr) == (Count != 0));

    if (!(*this)(Count))
        return false;

    for (size_t i = 0; i < static_cast<size_t>(Count); ++i)
    {
        if (!ElemSerializer(*this, SrcArray[i]))
            return false;
    }

    return true;
}